

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe50At6(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)((uint)(*buf >> 6) + (uint)buf[1] * 4 | (uint)buf[2] << 10 | (uint)buf[3] << 0x12)
          | (ulong)buf[4] << 0x1a | (ulong)buf[5] << 0x22 | (ulong)buf[6] << 0x2a;
  uVar1 = uVar2 | 0xfffc000000000000;
  if (-1 < (char)buf[6]) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe50At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0x3ffffffffffff);

    if (res >> 49) {
        res |= UINT64_C(0xfffc000000000000);
    }

    return static_cast<std::int64_t>(res);
}